

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventmultiplexer.cxx
# Opt level: O3

bool __thiscall EventMultiplexer::addSource(EventMultiplexer *this,StochasticEventGenerator *source)

{
  pointer ppSVar1;
  iterator __position;
  pointer ppSVar2;
  StochasticEventGenerator *local_28;
  
  ppSVar1 = (this->multiSources).
            super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->multiSources).
       super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->multiSources).
      super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_28 = source;
    std::vector<StochasticEventGenerator*,std::allocator<StochasticEventGenerator*>>::
    _M_realloc_insert<StochasticEventGenerator*const&>
              ((vector<StochasticEventGenerator*,std::allocator<StochasticEventGenerator*>> *)
               &this->multiSources,__position,&local_28);
    ppSVar2 = (this->multiSources).
              super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = source;
    ppSVar2 = (this->multiSources).
              super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->multiSources).
    super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppSVar2;
  }
  return (long)ppSVar2 -
         (long)(this->multiSources).
               super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3 ==
         (ulong)((int)((ulong)((long)__position._M_current - (long)ppSVar1) >> 3) + 1);
}

Assistant:

bool EventMultiplexer::addSource( StochasticEventGenerator *source )
{
	uint sizeBefore = multiSources.size();
	multiSources.push_back(source);

	return multiSources.size() == sizeBefore+1;
}